

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-home-power.c
# Opt level: O1

int32_t borg_power_home(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ushort uVar14;
  ushort uVar15;
  int iVar16;
  bool bVar17;
  
  if (num_LIGHT == 1) {
    iVar4 = 0x96;
  }
  else if (num_LIGHT == 2) {
    iVar4 = 0xaa;
  }
  else {
    iVar4 = 0;
    if (2 < num_LIGHT) {
      iVar4 = num_LIGHT * 5 + 0xa0;
    }
  }
  if (num_slow_digest == 2) {
    iVar4 = iVar4 + 0x46;
  }
  else if (num_slow_digest == 1) {
    iVar4 = iVar4 + 0x32;
  }
  else if (2 < num_slow_digest) {
    iVar4 = iVar4 + num_slow_digest * 5 + 0x3c;
  }
  if (num_regenerate == 2) {
    iVar4 = iVar4 + 100;
  }
  else if (num_regenerate == 1) {
    iVar4 = iVar4 + 0x4b;
  }
  else if (2 < num_regenerate) {
    iVar4 = iVar4 + num_regenerate * 10 + 0x50;
  }
  if (num_telepathy == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_telepathy == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_telepathy) {
    iVar4 = iVar4 + num_telepathy * 10 + 0x5c8;
  }
  if (num_see_inv == 2) {
    iVar4 = iVar4 + 0x4b0;
  }
  else if (num_see_inv == 1) {
    iVar4 = iVar4 + 800;
  }
  else if (2 < num_see_inv) {
    iVar4 = iVar4 + num_see_inv * 10 + 0x49c;
  }
  if (num_ffall == 2) {
    iVar4 = iVar4 + 0xf;
  }
  else if (num_ffall == 1) {
    iVar4 = iVar4 + 10;
  }
  else if (2 < num_ffall) {
    iVar4 = iVar4 + (uint)(ushort)num_ffall + 0xd;
  }
  if (num_free_act == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_free_act == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_free_act) {
    iVar4 = iVar4 + num_free_act * 10 + 0x5c8;
  }
  if (num_hold_life == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_hold_life == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_hold_life) {
    iVar4 = iVar4 + num_hold_life * 10 + 0x5c8;
  }
  if (num_resist_acid == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_resist_acid == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_resist_acid) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_acid + 0x5da;
  }
  if (num_immune_acid == 2) {
    iVar4 = iVar4 + 5000;
  }
  else if (num_immune_acid == 1) {
    iVar4 = iVar4 + 3000;
  }
  else if (2 < num_immune_acid) {
    iVar4 = iVar4 + num_immune_acid * 0x1e + 0x134c;
  }
  if (num_resist_elec == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_resist_elec == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_resist_elec) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_elec + 0x5da;
  }
  if (num_immune_elec == 2) {
    iVar4 = iVar4 + 5000;
  }
  else if (num_immune_elec == 1) {
    iVar4 = iVar4 + 3000;
  }
  else if (2 < num_immune_elec) {
    iVar4 = iVar4 + num_immune_elec * 0x1e + 0x134c;
  }
  if (num_resist_fire == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_resist_fire == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_resist_fire) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_fire + 0x5da;
  }
  if (num_immune_fire == 2) {
    iVar4 = iVar4 + 5000;
  }
  else if (num_immune_fire == 1) {
    iVar4 = iVar4 + 3000;
  }
  else if (2 < num_immune_fire) {
    iVar4 = iVar4 + num_immune_fire * 0x1e + 0x134c;
  }
  if (num_resist_cold == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_resist_cold == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_resist_cold) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_cold + 0x5da;
  }
  if (num_immune_cold == 2) {
    iVar4 = iVar4 + 5000;
  }
  else if (num_immune_cold == 1) {
    iVar4 = iVar4 + 3000;
  }
  else if (2 < num_immune_cold) {
    iVar4 = iVar4 + num_immune_cold * 0x1e + 0x134c;
  }
  if (num_resist_pois == 2) {
    iVar4 = iVar4 + 9000;
  }
  else if (num_resist_pois == 1) {
    iVar4 = iVar4 + 5000;
  }
  else if (2 < num_resist_pois) {
    iVar4 = iVar4 + num_resist_pois * 0x28 + 0x22d8;
  }
  if (num_resist_conf == 2) {
    iVar4 = iVar4 + 8000;
  }
  else if (num_resist_conf == 1) {
    iVar4 = iVar4 + 2000;
  }
  else if (2 < num_resist_conf) {
    iVar4 = iVar4 + num_resist_conf * 0x2d + 0x1ee6;
  }
  if (num_resist_sound == 2) {
    iVar4 = iVar4 + 700;
  }
  else if (num_resist_sound == 1) {
    iVar4 = iVar4 + 500;
  }
  else if (2 < num_resist_sound) {
    iVar4 = iVar4 + num_resist_sound * 0x1e + 0x280;
  }
  if (num_resist_LIGHT == 2) {
    iVar4 = iVar4 + 0x96;
  }
  else if (num_resist_LIGHT == 1) {
    iVar4 = iVar4 + 100;
  }
  else if (2 < num_resist_LIGHT) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_LIGHT + 0x94;
  }
  if (num_resist_dark == 2) {
    iVar4 = iVar4 + 0x96;
  }
  else if (num_resist_dark == 1) {
    iVar4 = iVar4 + 100;
  }
  else if (2 < num_resist_dark) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_dark + 0x94;
  }
  if (num_resist_chaos == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_resist_chaos == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_resist_chaos) {
    iVar4 = iVar4 + num_resist_chaos * 10 + 0x5c8;
  }
  if (num_resist_disen == 2) {
    iVar4 = iVar4 + 7000;
  }
  else if (num_resist_disen == 1) {
    iVar4 = iVar4 + 5000;
  }
  else if (2 < num_resist_disen) {
    iVar4 = iVar4 + num_resist_disen * 0x23 + 0x1b12;
  }
  if (num_resist_shard == 2) {
    iVar4 = iVar4 + 0x96;
  }
  else if (num_resist_shard == 1) {
    iVar4 = iVar4 + 100;
  }
  else if (2 < num_resist_shard) {
    iVar4 = iVar4 + (uint)(ushort)num_resist_shard + 0x94;
  }
  if (num_resist_nexus == 2) {
    iVar4 = iVar4 + 300;
  }
  else if (num_resist_nexus == 1) {
    iVar4 = iVar4 + 200;
  }
  else if (2 < num_resist_nexus) {
    iVar4 = iVar4 + num_resist_nexus * 2 + 0x128;
  }
  if (num_resist_blind == 2) {
    iVar4 = iVar4 + 1000;
  }
  else if (num_resist_blind == 1) {
    iVar4 = iVar4 + 500;
  }
  else if (2 < num_resist_blind) {
    iVar4 = iVar4 + num_resist_blind * 5 + 0x3de;
  }
  if (num_resist_neth == 2) {
    iVar4 = iVar4 + 4000;
  }
  else if (num_resist_neth == 1) {
    iVar4 = iVar4 + 3000;
  }
  else if (2 < num_resist_neth) {
    iVar4 = iVar4 + num_resist_neth * 0x2d + 0xf46;
  }
  if (home_stat_add[0] < 9) {
    iVar4 = home_stat_add[0] * 300 + iVar4;
  }
  else if (home_stat_add[0] < 0xf) {
    iVar4 = (short)(home_stat_add[0] + -9) * 200 + iVar4 + 0xa8c;
  }
  else {
    iVar4 = (uint)(ushort)home_stat_add[0] + iVar4 + 0xf2d;
  }
  if (home_stat_add[3] < 9) {
    iVar4 = home_stat_add[3] * 300 + iVar4;
  }
  else if (home_stat_add[3] < 0xf) {
    iVar4 = (short)(home_stat_add[3] + -9) * 200 + iVar4 + 0xa8c;
  }
  else {
    iVar4 = (uint)(ushort)home_stat_add[3] + iVar4 + 0xf2d;
  }
  if (home_stat_add[4] < 0xf) {
    iVar4 = home_stat_add[4] * 300 + iVar4;
  }
  else if (home_stat_add[4] < 0x15) {
    iVar4 = iVar4 + (short)(home_stat_add[4] + -0xf) * 200 + 0x1194;
  }
  else {
    iVar4 = (uint)(ushort)home_stat_add[4] + iVar4 + 0x162f;
  }
  wVar5 = borg_spell_stat();
  if (L'\xffffffff' < wVar5) {
    iVar6 = (int)home_stat_add[(uint)wVar5];
    if (iVar6 < 0x14) {
      iVar4 = iVar4 + iVar6 * 400;
    }
    else if (home_stat_add[(uint)wVar5] < 0x1a) {
      iVar4 = iVar4 + iVar6 * 300 + 2000;
    }
    else {
      iVar4 = iVar4 + iVar6 * 5 + 0xe56;
    }
  }
  if (num_sustain_str == 2) {
    iVar4 = iVar4 + 0xfa;
  }
  else if (num_sustain_str == 1) {
    iVar4 = iVar4 + 200;
  }
  else if (2 < num_sustain_str) {
    iVar4 = iVar4 + (uint)(ushort)num_sustain_str + 0xf8;
  }
  if (num_sustain_int == 2) {
    iVar4 = iVar4 + 0xfa;
  }
  else if (num_sustain_int == 1) {
    iVar4 = iVar4 + 200;
  }
  else if (2 < num_sustain_int) {
    iVar4 = iVar4 + (uint)(ushort)num_sustain_int + 0xf8;
  }
  if (num_sustain_wis == 2) {
    iVar4 = iVar4 + 0xfa;
  }
  else if (num_sustain_wis == 1) {
    iVar4 = iVar4 + 200;
  }
  else if (2 < num_sustain_wis) {
    iVar4 = iVar4 + (uint)(ushort)num_sustain_wis + 0xf8;
  }
  if (num_sustain_con == 2) {
    iVar4 = iVar4 + 0xfa;
  }
  else if (num_sustain_con == 1) {
    iVar4 = iVar4 + 200;
  }
  else if (2 < num_sustain_con) {
    iVar4 = iVar4 + (uint)(ushort)num_sustain_con + 0xf8;
  }
  if (num_sustain_dex == 2) {
    iVar4 = iVar4 + 0xfa;
  }
  else if (num_sustain_dex == 1) {
    iVar4 = iVar4 + 200;
  }
  else if (2 < num_sustain_dex) {
    iVar4 = iVar4 + (uint)(ushort)num_sustain_dex + 0xf8;
  }
  if (num_sustain_all == 2) {
    iVar4 = iVar4 + 0x5dc;
  }
  else if (num_sustain_all == 1) {
    iVar4 = iVar4 + 1000;
  }
  else if (2 < num_sustain_all) {
    iVar4 = iVar4 + (uint)(ushort)num_sustain_all + 0x5da;
  }
  iVar6 = (int)num_weapons;
  if (iVar6 < 6) {
    if (1 < num_weapons) {
      iVar4 = iVar4 + iVar6 * -100 + 100;
    }
  }
  else {
    iVar4 = iVar4 + iVar6 * -2000 + 10000;
  }
  iVar6 = 0;
  if (2 < num_bow) {
    iVar6 = num_bow * -1000 + 2000;
  }
  iVar6 = iVar6 + iVar4;
  iVar4 = (int)num_rings;
  if (iVar4 < 7) {
    if (4 < num_rings) {
      iVar6 = iVar6 + iVar4 * -2000 + 8000;
    }
  }
  else {
    iVar6 = iVar6 + iVar4 * -4000 + 24000;
  }
  iVar4 = 0;
  if (borg.trait[0x24] < 10) {
    iVar10 = (int)num_food;
    if (kb_info[0x1c].max_stack < (int)num_food) {
      iVar10 = kb_info[0x1c].max_stack;
    }
    iVar4 = 0;
    if (0 < iVar10) {
      iVar4 = iVar10 * 0x1f36 + ((iVar10 + -2) * (iVar10 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  iVar10 = kb_info[0x19].max_stack;
  iVar11 = (int)num_ident;
  if (iVar10 < num_ident) {
    iVar11 = iVar10;
  }
  if (0 < iVar11) {
    iVar4 = iVar4 + iVar11 * 0x7c6 + ((iVar11 + -2) * (iVar11 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar11 = borg.trait[0x23];
  if (iVar11 < 0x2d) {
    iVar9 = (int)num_enchant_to_a;
    if (iVar10 < num_enchant_to_a) {
      iVar9 = iVar10;
    }
    if (0 < iVar9) {
      iVar4 = iVar4 + iVar9 * 0x1ea + ((iVar9 + -2) * (iVar9 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  if (iVar11 < 0x2d) {
    iVar9 = (int)num_enchant_to_h;
    if (iVar10 < num_enchant_to_h) {
      iVar9 = iVar10;
    }
    if (0 < iVar9) {
      iVar4 = iVar4 + iVar9 * 0x1ea + ((iVar9 + -2) * (iVar9 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  if (iVar11 < 0x2d) {
    iVar9 = (int)num_enchant_to_d;
    if (iVar10 < num_enchant_to_d) {
      iVar9 = iVar10;
    }
    if (0 < iVar9) {
      iVar4 = iVar4 + iVar9 * 0x1ea + ((iVar9 + -2) * (iVar9 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  iVar9 = (int)num_pfe;
  if (iVar10 < num_pfe) {
    iVar9 = iVar10;
  }
  if (0 < iVar9) {
    iVar4 = iVar4 + iVar9 * 0x1ea + ((iVar9 + -2) * (iVar9 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar9 = (int)num_glyph;
  if (iVar10 < num_glyph) {
    iVar9 = iVar10;
  }
  if (0 < iVar9) {
    iVar4 = iVar4 + iVar9 * 0x1ea + ((iVar9 + -2) * (iVar9 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar16 = iVar10 * 2;
  iVar9 = (int)num_genocide;
  if (iVar16 < num_genocide) {
    iVar9 = iVar16;
  }
  if (0 < iVar9) {
    iVar4 = iVar4 + iVar9 * 0x1ea + ((iVar9 + -2) * (iVar9 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar9 = (int)num_mass_genocide;
  if (iVar16 < num_mass_genocide) {
    iVar9 = iVar16;
  }
  iVar16 = 0;
  if (0 < iVar9) {
    iVar16 = iVar9 * 500;
  }
  iVar16 = iVar16 + iVar4;
  iVar4 = (int)num_recharge;
  if (iVar10 < num_recharge) {
    iVar4 = iVar10;
  }
  if (0 < iVar4) {
    iVar16 = iVar4 * 0x1ea + iVar16 + ((iVar4 + -2) * (iVar4 + -1) & 0xfffffffeU) * -5 + 10;
  }
  if ((borg.trait[0x19] == 0) && (borg.trait[0x6a] - 0x15U < 0x3b)) {
    uVar8 = kb_info[0x1a].max_stack;
    uVar7 = (int)num_pot_rheat;
    if ((int)uVar8 < (int)num_pot_rheat) {
      uVar7 = uVar8;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    else {
      iVar16 = iVar16 + uVar7 * 0x5a + ((uVar7 - 2) * (uVar7 - 1) & 0xfffffffe) * -5 + 10;
    }
    uVar1 = (int)num_pot_rcold;
    if ((int)uVar8 < (int)num_pot_rcold) {
      uVar1 = uVar8;
    }
    if (uVar1 - uVar7 != 0 && (int)uVar7 <= (int)uVar1) {
      iVar16 = iVar16 + uVar7 * -10 + (uVar7 * -10 + 0x5a) * (uVar1 + ~uVar7) +
               (((uVar1 - uVar7) + -2) * (uVar1 + ~uVar7) & 0xfffffffe) * -5 + 100;
    }
  }
  if (0 < num_recall) {
    uVar14 = 4;
    if ((ushort)(num_recall - 1U) < 4) {
      uVar14 = num_recall - 1U;
    }
    iVar16 = iVar16 + (uint)(ushort)(uVar14 * 100) + 100;
  }
  if (0 < num_escape) {
    uVar14 = 0x54;
    if ((ushort)(num_escape - 1U) < 0x54) {
      uVar14 = num_escape - 1U;
    }
    uVar8 = (uint)uVar14;
    iVar16 = iVar16 + uVar8 * 0x7c6 + ((uVar8 - 1) * uVar8 & 0xfffffffe) * -5 + 2000;
  }
  iVar4 = 0;
  if (kb_info[0x16].max_stack < (int)num_tele_staves) {
    iVar4 = (kb_info[0x16].max_stack - (int)num_tele_staves) * 50000;
  }
  iVar4 = iVar4 + iVar16;
  if (0 < num_teleport) {
    uVar14 = 0x54;
    if ((ushort)(num_teleport - 1U) < 0x54) {
      uVar14 = num_teleport - 1U;
    }
    iVar4 = (uint)uVar14 * 5000 + 5000 + iVar4;
  }
  if (borg.trait[0x24] < 10) {
    iVar9 = (int)num_phase;
    if (iVar10 < num_phase) {
      iVar9 = iVar10;
    }
    if (0 < iVar9) {
      iVar4 = iVar9 * 5000 + iVar4;
    }
  }
  if (1 < borg.trait[0x1f]) {
    iVar10 = (int)num_mana;
    if (kb_info[0x1a].max_stack < (int)num_mana) {
      iVar10 = kb_info[0x1a].max_stack;
    }
    if (0 < iVar10) {
      iVar4 = ((iVar4 + iVar10 * 0x1768) - ((iVar10 * 4 + -8) * (iVar10 + 0x3fffffff) & 0xfffffff8U)
              ) + 8;
    }
  }
  if ((iVar11 == 1) && (0 < num_heal)) {
    uVar14 = 9;
    if ((ushort)(num_heal - 1U) < 9) {
      uVar14 = num_heal - 1U;
    }
    iVar4 = iVar4 + (uint)uVar14 * -5000 + -5000;
  }
  iVar10 = (int)num_cure_critical;
  if (kb_info[0x1a].max_stack < (int)num_cure_critical) {
    iVar10 = kb_info[0x1a].max_stack;
  }
  if (0 < iVar10) {
    iVar4 = iVar4 + iVar10 * 0x5d2 + ((iVar10 + -2) * (iVar10 + -1) & 0xfffffffeU) * -5 + 10;
  }
  if (0 < num_heal) {
    uVar14 = 0x59;
    if ((ushort)(num_heal - 1U) < 0x59) {
      uVar14 = num_heal - 1U;
    }
    iVar4 = iVar4 + (uint)uVar14 * 3000 + 3000;
  }
  if (0 < num_ezheal) {
    uVar14 = num_ezheal - 1;
    if (0xc4 < (ushort)(num_ezheal - 1U)) {
      uVar14 = 0xc5;
    }
    iVar4 = iVar4 + (uint)uVar14 * 8000 + 8000;
  }
  if (0 < num_life) {
    uVar14 = num_life - 1;
    if (0xc4 < (ushort)(num_life - 1U)) {
      uVar14 = 0xc5;
    }
    iVar4 = iVar4 + (uint)uVar14 * 9000 + 9000;
  }
  if ((0x23 < iVar11) && (0 < num_cure_serious)) {
    uVar14 = 0x59;
    if ((ushort)(num_cure_serious - 1U) < 0x59) {
      uVar14 = num_cure_serious - 1U;
    }
    uVar8 = (uint)uVar14;
    iVar4 = iVar4 + uVar8 * -0x5d2 + ((uVar8 - 1) * uVar8 >> 1) * 10 + -0x5dc;
  }
  iVar10 = iVar4 + -0x1d4c;
  if (num_fix_exp == 0) {
    iVar10 = iVar4;
  }
  if (iVar11 != 0x32) {
    iVar10 = iVar4;
  }
  if (iVar11 - 0x24U < 0xe) {
    if (num_fix_exp < 1) goto LAB_002274f4;
    bVar17 = (ushort)(num_fix_exp - 1U) < 0x45;
    uVar14 = 0x45;
  }
  else {
    if (0x23 < iVar11 || num_fix_exp < 1) goto LAB_002274f4;
    bVar17 = (ushort)(num_fix_exp - 1U) < 4;
    uVar14 = 4;
  }
  if (bVar17) {
    uVar14 = num_fix_exp - 1;
  }
  iVar10 = iVar10 + (uint)uVar14 * 0x3de + ((uVar14 - 1) * (uint)uVar14 & 0xfffffffe) * -5 + 1000;
LAB_002274f4:
  lVar13 = 0;
  do {
    if (iVar11 < 0xf) {
      uVar14 = num_book[lVar13];
      uVar15 = uVar14;
      if ((short)uVar14 < 1) {
        uVar15 = 0;
      }
      iVar4 = 5000;
      do {
        if ((uint)uVar15 * 10 + iVar4 == 5000) break;
        iVar9 = iVar4;
        if (uVar14 == 0) {
          iVar9 = 0;
        }
        iVar10 = iVar10 + iVar9;
        iVar4 = iVar4 + -10;
      } while (iVar4 != 0x1356);
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 9) {
      iVar4 = num_ego * 5000 + num_artifact * 500 + iVar10;
      if (home_un_id != 0) {
        iVar4 = iVar4 + ((int)home_un_id - borg.trait[0xd9]) * 0x3ed;
      }
      iVar11 = (uint)(ushort)num_neck * -0x5dc + 0x1194;
      iVar10 = 0;
      if (num_neck < 4) {
        iVar11 = 0;
      }
      iVar9 = (uint)(ushort)num_armor * -1000 + 6000;
      if (num_armor < 7) {
        iVar9 = iVar10;
      }
      iVar16 = (uint)(ushort)num_cloaks * -1000 + 3000;
      if (num_cloaks < 4) {
        iVar16 = 0;
      }
      iVar2 = (uint)(ushort)num_shields * -1000 + 3000;
      if (num_shields < 4) {
        iVar2 = iVar10;
      }
      iVar12 = (uint)(ushort)num_hats * -1000 + 4000;
      if (num_hats < 5) {
        iVar12 = 0;
      }
      iVar3 = (uint)(ushort)num_gloves * -1000 + 3000;
      if (num_gloves < 4) {
        iVar3 = iVar10;
      }
      iVar10 = (uint)(ushort)num_boots * -1000 + 3000;
      if (num_boots < 4) {
        iVar10 = 0;
      }
      return num_duplicate_items * -50000 +
             num_bad_gloves * -3000 + num_edged_weapon * -0x32 + iVar10 + iVar3 +
             iVar12 + iVar2 + iVar16 + iVar9 + iVar11 + iVar6 + (int)home_damage + iVar4;
    }
  } while( true );
}

Assistant:

static int32_t borg_power_home_aux1(void)
{
    int32_t value = 0L;

    /* This would be better separated by item type (so 1 bonus for resist cold
     * armor */
    /*   1 bonus for resist cold shield... but that would take a bunch more
     * code. */

    /* try to collect at least 2 of each resist/power (for swapping) */
    /* This can be used to get rid of extra artifacts... */

    /* spare lite sources.  Artifacts only */
    if (num_LIGHT == 1)
        value += 150L;
    else if (num_LIGHT == 2)
        value += 170L;
    else if (num_LIGHT > 2)
        value += 170L + (num_LIGHT - 2) * 5L;

    if (num_slow_digest == 1)
        value += 50L;
    else if (num_slow_digest == 2)
        value += 70L;
    else if (num_slow_digest > 2)
        value += 70L + (num_slow_digest - 2) * 5L;

    if (num_regenerate == 1)
        value += 75L;
    else if (num_regenerate == 2)
        value += 100L;
    else if (num_regenerate > 2)
        value += 100L + (num_regenerate - 2) * 10L;

    if (num_telepathy == 1)
        value += 1000L;
    else if (num_telepathy == 2)
        value += 1500L;
    else if (num_telepathy > 2)
        value += 1500L + (num_telepathy - 2) * 10L;

    if (num_see_inv == 1)
        value += 800L;
    else if (num_see_inv == 2)
        value += 1200L;
    else if (num_see_inv > 2)
        value += 1200L + (num_see_inv - 2) * 10L;

    if (num_ffall == 1)
        value += 10L;
    else if (num_ffall == 2)
        value += 15L;
    else if (num_ffall > 2)
        value += 15L + (num_ffall - 2) * 1L;

    if (num_free_act == 1)
        value += 1000L;
    else if (num_free_act == 2)
        value += 1500L;
    else if (num_free_act > 2)
        value += 1500L + (num_free_act - 2) * 10L;

    if (num_hold_life == 1)
        value += 1000L;
    else if (num_hold_life == 2)
        value += 1500L;
    else if (num_hold_life > 2)
        value += 1500L + (num_hold_life - 2) * 10L;

    if (num_resist_acid == 1)
        value += 1000L;
    else if (num_resist_acid == 2)
        value += 1500L;
    else if (num_resist_acid > 2)
        value += 1500L + (num_resist_acid - 2) * 1L;
    if (num_immune_acid == 1)
        value += 3000L;
    else if (num_immune_acid == 2)
        value += 5000L;
    else if (num_immune_acid > 2)
        value += 5000L + (num_immune_acid - 2) * 30L;

    if (num_resist_elec == 1)
        value += 1000L;
    else if (num_resist_elec == 2)
        value += 1500L;
    else if (num_resist_elec > 2)
        value += 1500L + (num_resist_elec - 2) * 1L;
    if (num_immune_elec == 1)
        value += 3000L;
    else if (num_immune_elec == 2)
        value += 5000L;
    else if (num_immune_elec > 2)
        value += 5000L + (num_immune_elec - 2) * 30L;

    if (num_resist_fire == 1)
        value += 1000L;
    else if (num_resist_fire == 2)
        value += 1500L;
    else if (num_resist_fire > 2)
        value += 1500L + (num_resist_fire - 2) * 1L;
    if (num_immune_fire == 1)
        value += 3000L;
    else if (num_immune_fire == 2)
        value += 5000L;
    else if (num_immune_fire > 2)
        value += 5000L + (num_immune_fire - 2) * 30L;

    if (num_resist_cold == 1)
        value += 1000L;
    else if (num_resist_cold == 2)
        value += 1500L;
    else if (num_resist_cold > 2)
        value += 1500L + (num_resist_cold - 2) * 1L;
    if (num_immune_cold == 1)
        value += 3000L;
    else if (num_immune_cold == 2)
        value += 5000L;
    else if (num_immune_cold > 2)
        value += 5000L + (num_immune_cold - 2) * 30L;

    if (num_resist_pois == 1)
        value += 5000L;
    else if (num_resist_pois == 2)
        value += 9000L;
    else if (num_resist_pois > 2)
        value += 9000L + (num_resist_pois - 2) * 40L;

    if (num_resist_conf == 1)
        value += 2000L;
    else if (num_resist_conf == 2)
        value += 8000L;
    else if (num_resist_conf > 2)
        value += 8000L + (num_resist_conf - 2) * 45L;

    if (num_resist_sound == 1)
        value += 500L;
    else if (num_resist_sound == 2)
        value += 700L;
    else if (num_resist_sound > 2)
        value += 700L + (num_resist_sound - 2) * 30L;

    if (num_resist_LIGHT == 1)
        value += 100L;
    else if (num_resist_LIGHT == 2)
        value += 150L;
    else if (num_resist_LIGHT > 2)
        value += 150L + (num_resist_LIGHT - 2) * 1L;

    if (num_resist_dark == 1)
        value += 100L;
    else if (num_resist_dark == 2)
        value += 150L;
    else if (num_resist_dark > 2)
        value += 150L + (num_resist_dark - 2) * 1L;

    if (num_resist_chaos == 1)
        value += 1000L;
    else if (num_resist_chaos == 2)
        value += 1500L;
    else if (num_resist_chaos > 2)
        value += 1500L + (num_resist_chaos - 2) * 10L;

    if (num_resist_disen == 1)
        value += 5000L;
    else if (num_resist_disen == 2)
        value += 7000L;
    else if (num_resist_disen > 2)
        value += 7000L + (num_resist_disen - 2) * 35L;

    if (num_resist_shard == 1)
        value += 100L;
    else if (num_resist_shard == 2)
        value += 150L;
    else if (num_resist_shard > 2)
        value += 150L + (num_resist_shard - 2) * 1L;

    if (num_resist_nexus == 1)
        value += 200L;
    else if (num_resist_nexus == 2)
        value += 300L;
    else if (num_resist_nexus > 2)
        value += 300L + (num_resist_nexus - 2) * 2L;

    if (num_resist_blind == 1)
        value += 500L;
    else if (num_resist_blind == 2)
        value += 1000L;
    else if (num_resist_blind > 2)
        value += 1000L + (num_resist_blind - 2) * 5L;

    if (num_resist_neth == 1)
        value += 3000L;
    else if (num_resist_neth == 2)
        value += 4000L;
    else if (num_resist_neth > 2)
        value += 4000L + (num_resist_neth - 2) * 45L;

    /* stat gain items as well...(good to carry ring of dex +6 in */
    /*                            house even if I don't need it right now) */
    if (home_stat_add[STAT_STR] < 9)
        value += home_stat_add[STAT_STR] * 300L;
    else if (home_stat_add[STAT_STR] < 15)
        value += 9 * 300L + (home_stat_add[STAT_STR] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_STR] - 15) * 1L;

    if (home_stat_add[STAT_DEX] < 9)
        value += home_stat_add[STAT_DEX] * 300L;
    else if (home_stat_add[STAT_DEX] < 15)
        value += 9 * 300L + (home_stat_add[STAT_DEX] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_DEX] - 15) * 1L;

    /* HACK extra con for thorin and other such things */
    if (home_stat_add[STAT_CON] < 15)
        value += home_stat_add[STAT_CON] * 300L;
    else if (home_stat_add[STAT_CON] < 21)
        value += 15 * 300L + (home_stat_add[STAT_CON] - 15) * 200L;
    else
        value += 15 * 300L + 6 * 200L + (home_stat_add[STAT_CON] - 21) * 1L;

    /* spell stat is only bonused for spell casters. */
    int spell_stat = borg_spell_stat();
    if (spell_stat >= 0) {
        if (home_stat_add[spell_stat] < 20)
            value += home_stat_add[spell_stat] * 400L;
        else if (home_stat_add[spell_stat] < 26)
            value += 20 * 400L + (home_stat_add[spell_stat] - 20) * 300L;
        else
            value
                += 20 * 100L + 6 * 300L + (home_stat_add[spell_stat] - 26) * 5L;
    }

    /* Sustains */
    if (num_sustain_str == 1)
        value += 200L;
    else if (num_sustain_str == 2)
        value += 250L;
    else if (num_sustain_str > 2)
        value += 250L + (num_sustain_str - 2) * 1L;

    if (num_sustain_int == 1)
        value += 200L;
    else if (num_sustain_int == 2)
        value += 250L;
    else if (num_sustain_int > 2)
        value += 250L + (num_sustain_int - 2) * 1L;

    if (num_sustain_wis == 1)
        value += 200L;
    else if (num_sustain_wis == 2)
        value += 250L;
    else if (num_sustain_wis > 2)
        value += 250L + (num_sustain_wis - 2) * 1L;

    if (num_sustain_con == 1)
        value += 200L;
    else if (num_sustain_con == 2)
        value += 250L;
    else if (num_sustain_con > 2)
        value += 250L + (num_sustain_con - 2) * 1L;

    if (num_sustain_dex == 1)
        value += 200L;
    else if (num_sustain_dex == 2)
        value += 250L;
    else if (num_sustain_dex > 2)
        value += 250L + (num_sustain_dex - 2) * 1L;

    if (num_sustain_all == 1)
        value += 1000L;
    else if (num_sustain_all == 2)
        value += 1500L;
    else if (num_sustain_all > 2)
        value += 1500L + (num_sustain_all - 2) * 1L;

    /* do a minus for too many duplicates.  This way we do not store */
    /* useless items and spread out types of items. */
    if (num_weapons > 5)
        value -= (num_weapons - 5) * 2000L;
    else if (num_weapons > 1)
        value -= (num_weapons - 1) * 100L;
    if (num_bow > 2)
        value -= (num_bow - 2) * 1000L;
    if (num_rings > 6)
        value -= (num_rings - 6) * 4000L;
    else if (num_rings > 4)
        value -= (num_rings - 4) * 2000L;
    if (num_neck > 3)
        value -= (num_neck - 3) * 1500L;
    else if (num_neck > 3)
        value -= (num_neck - 3) * 700L;
    if (num_armor > 6)
        value -= (num_armor - 6) * 1000L;
    if (num_cloaks > 3)
        value -= (num_cloaks - 3) * 1000L;
    if (num_shields > 3)
        value -= (num_shields - 3) * 1000L;
    if (num_hats > 4)
        value -= (num_hats - 4) * 1000L;
    if (num_gloves > 3)
        value -= (num_gloves - 3) * 1000L;
    if (num_boots > 3)
        value -= (num_boots - 3) * 1000L;

    value += home_damage;

    /* if edged and priest, small penalty   */
    value -= num_edged_weapon * 50L;

    /* if gloves and mage or ranger and not FA/Dex, dump it. */
    value -= num_bad_gloves * 3000L;

    /* do not allow duplication of items. */
    value -= num_duplicate_items * 50000L;

    /* Return the value */
    return (value);
}